

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erfunc.c
# Opt level: O2

double erfcinv(double x)

{
  double dVar1;
  double dVar2;
  
  if ((2.0 < x) || (x < 0.0)) {
    printf("The Input takes values between 0.0 and 2.0");
    exit(1);
  }
  if ((0.0625 <= x) && (x < 2.0)) {
    dVar1 = erfinv(1.0 - x);
    return dVar1;
  }
  if ((0.0625 <= x) || (x < 1e-100)) {
    if ((1e-100 <= x) || (x <= 2.2251e-308)) {
      if (2.2251e-308 < x) {
        return -1.79e+308;
      }
      return 1.79e+308;
    }
    dVar1 = log(x);
    if (-0.0 < dVar1) {
      dVar1 = sqrt(-dVar1);
    }
    else {
      dVar1 = SQRT(-dVar1);
    }
    dVar1 = 1.0 / dVar1;
    dVar2 = (dVar1 * -0.5374947401 + 0.97302949837) * dVar1 +
            0.00980456202915 / dVar1 + 0.363667889171;
    dVar1 = (dVar1 + 0.363699971544) * dVar1 + 0.00980451277802;
  }
  else {
    dVar1 = log(x);
    if (-0.0 < dVar1) {
      dVar1 = sqrt(-dVar1);
    }
    else {
      dVar1 = SQRT(-dVar1);
    }
    dVar1 = 1.0 / dVar1;
    dVar2 = (((dVar1 * -0.16444156791 + 0.680544246825) * dVar1 + -1.128081391617) * dVar1 +
            0.690969348887) * dVar1 + 0.1550470003116 / dVar1 + 1.382719649631;
    dVar1 = (dVar1 + 1.385228141995) * dVar1 + 0.155024849822;
  }
  return dVar2 / dVar1;
}

Assistant:

double erfcinv(double x) {
	double oup,xinf,pi,t;
	
	/*
	 * This implementation is based on 
	 * J. M. Blair, C. A. Edwards, and J. H. Johnson, "Rational
	Chebyshev Approximations for the Inverse of the Error Function",
	Mathematics of Computation, 30 (1976) 827-830 
	* 
	* Tables from www.jstor.org's copy of the paper are used in this
	 * implementation.
	 */ 
	
//	xinf = 1.79e308;
//	pi  = 3.1415926535897932384626434;
	xinf = XINFVAL;
	pi  = PIVAL;
	
	if (x > 2. || x < 0.) {
		 printf("The Input takes values between 0.0 and 2.0");
		 exit(1);
	 }
	 
	if( x >= 0.0625 && x <2.0) {
		oup = erfinv( 1.0 - x );
	} else if (x < 0.0625 && x >= 1.0e-100) {
		//Coefficients from table 50 
		double p[6] = {0.1550470003116,1.382719649631,0.690969348887, \
			-1.128081391617, 0.680544246825,-0.16444156791};
		double q[3] = {0.155024849822,1.385228141995,1.000000000000};
		
		t=1.0/sqrt(-log(x));
		oup = (p[0]/t+p[1]+t*(p[2]+t*(p[3]+t*(p[4]+t*p[5]))))/
          (q[0]+t*(q[1]+t*(q[2])));
		
//	} else if( x < 1.0e-100 && x > 1.0e-1000 ) {
	} else if( x < 1.0e-100 && x > XNINFVAL ) {
		//Coefficients from table 70
		double p[4]={0.00980456202915,0.363667889171,0.97302949837,-0.5374947401};
		double q[3]={0.00980451277802,0.363699971544,1.000000000000}; 
		t = 1.0/sqrt(-log(x));
		oup = (p[0]/t+p[1]+t*(p[2]+t*p[3]))/(q[0]+t*(q[1]+t*(q[2])));
		
//	} else if (x <= 1.0e-1000) {
	} else if (x <= XNINFVAL) {
		 oup = xinf;
	} else if (x == 2.) {
		 oup = -xinf;
	}
	
	return oup;
	
}